

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int32_t ne_core_main(int32_t argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  char cVar4;
  bool simulated_environment;
  
  if (1 < argc) {
    pcVar1 = argv[1];
    simulated_environment = true;
    if (pcVar1 == "--simulated") goto LAB_00108d3f;
    if (pcVar1 != (char *)0x0) {
      cVar2 = *pcVar1;
      cVar4 = '-';
      if (cVar2 == '-') {
        cVar2 = '-';
        lVar3 = 1;
        do {
          if (cVar2 == '\0') goto LAB_00108d3f;
          cVar2 = pcVar1[lVar3];
          cVar4 = "--simulated"[lVar3];
          lVar3 = lVar3 + 1;
        } while (cVar2 == cVar4);
      }
      simulated_environment = cVar2 == cVar4;
      goto LAB_00108d3f;
    }
  }
  simulated_environment = false;
LAB_00108d3f:
  test_core(simulated_environment);
  test_io(simulated_environment);
  test_time(simulated_environment);
  test_filesystem(simulated_environment);
  return 0;
}

Assistant:

int32_t ne_core_main(int32_t argc, char *argv[])
{
  auto simulated_environment = static_cast<ne_core_bool>(
      argc >= 2 && test_string_compare(argv[1], "--simulated") == 0);

  // Invalid, but until we get a way for modules to run their own initialize
  // and register tests (dependency upon test) then  we must do this.
  extern void test_core(ne_core_bool simulated_environment);
  extern void test_io(ne_core_bool simulated_environment);
  extern void test_time(ne_core_bool simulated_environment);
  extern void test_filesystem(ne_core_bool simulated_environment);
  test_core(simulated_environment);
  test_io(simulated_environment);
  test_time(simulated_environment);
  test_filesystem(simulated_environment);

  // We can't know whether the test completed by this point do to callbacks.
  return 0;
}